

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::~ImplicitProducer(ImplicitProducer *this)

{
  FreeList<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict3 _Var3;
  ulong uVar4;
  ulong uVar5;
  ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *pCVar6;
  __pointer_type pBVar7;
  __int_type _Var8;
  Block *pBVar9;
  BlockIndexHeader *pBVar10;
  __pointer_type pBVar11;
  __pointer_type pBVar12;
  long lVar13;
  __pointer_type pBVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_024b1cb8;
  uVar4 = (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  uVar5 = (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i;
  if (uVar5 != uVar4) {
    pBVar14 = (__pointer_type)0x0;
    uVar16 = uVar5;
    do {
      if (pBVar14 == (__pointer_type)0x0 || (uVar16 & 0x1f) == 0) {
        if (pBVar14 != (__pointer_type)0x0) {
          pCVar6 = (this->super_ProducerBase).parent;
          LOCK();
          paVar2 = &pBVar14->freeListRefs;
          _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
          UNLOCK();
          if (_Var3 == 0) {
            pBVar11 = (pCVar6->freeList).freeListHead._M_b._M_p;
            do {
              (pBVar14->freeListNext)._M_b._M_p = pBVar11;
              (pBVar14->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
              pFVar1 = &pCVar6->freeList;
              LOCK();
              pBVar12 = (pFVar1->freeListHead)._M_b._M_p;
              bVar17 = pBVar11 == pBVar12;
              if (bVar17) {
                (pFVar1->freeListHead)._M_b._M_p = pBVar14;
                pBVar12 = pBVar11;
              }
              UNLOCK();
              if (bVar17) break;
              LOCK();
              paVar2 = &pBVar14->freeListRefs;
              _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
              (paVar2->super___atomic_base<unsigned_int>)._M_i =
                   (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
              UNLOCK();
              pBVar11 = pBVar12;
            } while (_Var3 == 1);
          }
        }
        pBVar7 = (this->blockIndex)._M_b._M_p;
        _Var8 = (pBVar7->tail).super___atomic_base<unsigned_long>._M_i;
        lVar13 = (uVar16 & 0xffffffffffffffe0) -
                 (pBVar7->index[_Var8]->key).super___atomic_base<unsigned_long>._M_i;
        lVar15 = lVar13 + 0x1f;
        if (-1 < lVar13) {
          lVar15 = lVar13;
        }
        pBVar14 = (pBVar7->index[pBVar7->capacity - 1 & (lVar15 >> 5) + _Var8]->value)._M_b._M_p;
      }
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           (pBVar14->elements + (ulong)(uint)((int)(uVar16 & 0x1f) << 4) + 8) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    (pBVar14->elements + (ulong)(uint)((int)(uVar16 & 0x1f) << 4) + 8));
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar4);
  }
  pBVar9 = (this->super_ProducerBase).tailBlock;
  if ((pBVar9 != (Block *)0x0) && ((uVar4 & 0x1f) != 0 || uVar5 != uVar4)) {
    pCVar6 = (this->super_ProducerBase).parent;
    LOCK();
    paVar2 = &pBVar9->freeListRefs;
    _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
    (paVar2->super___atomic_base<unsigned_int>)._M_i =
         (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
    UNLOCK();
    if (_Var3 == 0) {
      pBVar14 = (pCVar6->freeList).freeListHead._M_b._M_p;
      do {
        (pBVar9->freeListNext)._M_b._M_p = pBVar14;
        (pBVar9->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
        pFVar1 = &pCVar6->freeList;
        LOCK();
        pBVar11 = (pFVar1->freeListHead)._M_b._M_p;
        bVar17 = pBVar14 == pBVar11;
        if (bVar17) {
          (pFVar1->freeListHead)._M_b._M_p = pBVar9;
          pBVar11 = pBVar14;
        }
        UNLOCK();
        if (bVar17) break;
        LOCK();
        paVar2 = &pBVar9->freeListRefs;
        _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
        UNLOCK();
        pBVar14 = pBVar11;
      } while (_Var3 == 1);
    }
  }
  pBVar7 = (this->blockIndex)._M_b._M_p;
  while (pBVar7 != (__pointer_type)0x0) {
    pBVar10 = pBVar7->prev;
    free(pBVar7);
    pBVar7 = pBVar10;
  }
  return;
}

Assistant:

~ImplicitProducer()
		{
			// Note that since we're in the destructor we can assume that all enqueue/dequeue operations
			// completed already; this means that all undequeued elements are placed contiguously across
			// contiguous blocks, and that only the first and last remaining blocks can be only partially
			// empty (all other remaining blocks must be completely full).
			
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
			// Unregister ourselves for thread termination notification
			if (!this->inactive.load(std::memory_order_relaxed)) {
				details::ThreadExitNotifier::unsubscribe(&threadExitListener);
			}
#endif
			
			// Destroy all remaining elements!
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto index = this->headIndex.load(std::memory_order_relaxed);
			Block* block = nullptr;
			assert(index == tail || details::circular_less_than(index, tail));
			bool forceFreeLastBlock = index != tail;		// If we enter the loop, then the last (tail) block will not be freed
			while (index != tail) {
				if ((index & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 || block == nullptr) {
					if (block != nullptr) {
						// Free the old block
						this->parent->add_block_to_free_list(block);
					}
					
					block = get_block_index_entry_for_index(index)->value.load(std::memory_order_relaxed);
				}
				
				((*block)[index])->~T();
				++index;
			}
			// Even if the queue is empty, there's still one block that's not on the free list
			// (unless the head index reached the end of it, in which case the tail will be poised
			// to create a new block).
			if (this->tailBlock != nullptr && (forceFreeLastBlock || (tail & static_cast<index_t>(BLOCK_SIZE - 1)) != 0)) {
				this->parent->add_block_to_free_list(this->tailBlock);
			}
			
			// Destroy block index
			auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
			if (localBlockIndex != nullptr) {
				for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
					localBlockIndex->index[i]->~BlockIndexEntry();
				}
				do {
					auto prev = localBlockIndex->prev;
					localBlockIndex->~BlockIndexHeader();
					(Traits::free)(localBlockIndex);
					localBlockIndex = prev;
				} while (localBlockIndex != nullptr);
			}
		}